

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O3

void replay_record_steal_internal(__cilkrts_worker *w,int32_t victim_id)

{
  full_frame *pfVar1;
  __cilkrts_stack_frame *p_Var2;
  
  pfVar1 = w->l->next_frame_ff;
  if (pfVar1 == (full_frame *)0x0) {
    replay_record_steal_internal_cold_2();
  }
  else {
    p_Var2 = pfVar1->call_stack;
    if (p_Var2 != (__cilkrts_stack_frame *)0x0) {
      write_to_replay_log(w,"Steal",&(p_Var2->field_9).spawn_helper_pedigree,victim_id,-1);
      return;
    }
  }
  replay_record_steal_internal_cold_1();
}

Assistant:

void replay_record_steal_internal(__cilkrts_worker *w, int32_t victim_id)
{
    // Follow the pedigree chain using worker's stack frame
    CILK_ASSERT(w->l->next_frame_ff);
    CILK_ASSERT(w->l->next_frame_ff->call_stack);

    // Record steal: STEAL pedigree victim_id thief_id
    write_to_replay_log (w, PED_TYPE_STR_STEAL,
                         &(w->l->next_frame_ff->call_stack->parent_pedigree),
                         victim_id);
}